

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QDnsServiceRecordPrivate>::reset
          (QSharedDataPointer<QDnsServiceRecordPrivate> *this,QDnsServiceRecordPrivate *ptr)

{
  Data *pDVar1;
  QDnsServiceRecordPrivate *pQVar2;
  
  pQVar2 = (this->d).ptr;
  if (pQVar2 != ptr) {
    if (ptr != (QDnsServiceRecordPrivate *)0x0) {
      LOCK();
      (ptr->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (ptr->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
      UNLOCK();
      pQVar2 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar2 != (QDnsServiceRecordPrivate *)0x0) {
      LOCK();
      (pQVar2->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar2->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (pQVar2->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        pDVar1 = (pQVar2->target).d.d;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar2->target).d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar1 = (pQVar2->super_QDnsRecordPrivate).name.d.d;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&((pQVar2->super_QDnsRecordPrivate).name.d.d)->super_QArrayData,2,0x10);
          }
        }
        operator_delete(pQVar2,0x48);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }